

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_symlink_stored(archive_read *a,archive_entry *entry,archive_string_conv *sconv)

{
  wchar_t wVar1;
  archive_entry *entry_00;
  int *piVar2;
  char *pcVar3;
  archive_string_conv *in_RDX;
  archive *in_RDI;
  int ret;
  rar *rar;
  char *p;
  void *h;
  archive *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  ssize_t *avail;
  size_t in_stack_ffffffffffffffd0;
  archive_read *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = 0;
  avail = *(ssize_t **)in_RDI[0x15].archive_format_name;
  entry_00 = (archive_entry *)
             rar_read_ahead(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,avail);
  if (entry_00 == (archive_entry *)0x0) {
    local_4 = -0x1e;
  }
  else {
    wVar1 = _archive_entry_copy_symlink_l
                      (entry_00,(char *)avail,CONCAT44(local_4,in_stack_ffffffffffffffc0),
                       (archive_string_conv *)in_stack_ffffffffffffffb8);
    if (wVar1 != L'\0') {
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        archive_set_error(in_RDI,0xc,"Can\'t allocate memory for link");
        return -0x1e;
      }
      pcVar3 = archive_string_conversion_charset_name(in_RDX);
      archive_set_error(in_RDI,0x54,"link cannot be converted from %s to current locale.",pcVar3);
      local_4 = -0x14;
      in_stack_ffffffffffffffb8 = in_RDI;
    }
    __archive_read_consume
              ((archive_read *)CONCAT44(local_4,in_stack_ffffffffffffffc0),
               (int64_t)in_stack_ffffffffffffffb8);
  }
  return local_4;
}

Assistant:

static int
read_symlink_stored(struct archive_read *a, struct archive_entry *entry,
                    struct archive_string_conv *sconv)
{
  const void *h;
  const char *p;
  struct rar *rar;
  int ret = (ARCHIVE_OK);

  rar = (struct rar *)(a->format->data);
  if ((h = rar_read_ahead(a, (size_t)rar->packed_size, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;

  if (archive_entry_copy_symlink_l(entry,
      p, (size_t)rar->packed_size, sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for link");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "link cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(sconv));
    ret = (ARCHIVE_WARN);
  }
  __archive_read_consume(a, rar->packed_size);
  return ret;
}